

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::EmitPropTypeof
          (ByteCodeGenerator *this,RegSlot lhsLocation,Symbol *sym,IdentPtr pid,FuncInfo *funcInfo)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  ProfileId profileId_00;
  OpCode op_00;
  ScopeType SVar4;
  DynamicLoadKind DVar5;
  PropertyId PVar6;
  RegSlot RVar7;
  uint32 uVar8;
  uint32 uVar9;
  uint uVar10;
  RegSlot RVar11;
  ByteCodeLabel labelID;
  int iVar12;
  undefined4 *puVar13;
  FuncInfo *pFVar14;
  FuncInfo *pFVar15;
  Scope *this_00;
  Type *pTVar16;
  int iVar17;
  PropertyId local_218;
  PropertyId local_15c;
  PropertyId local_110;
  Scope *local_e0;
  PropertyId propertyId_2;
  RegSlot instLocation;
  int i;
  ByteCodeLabel doneLabel;
  OpCode op;
  bool chkBlockVar;
  RegSlot tmpLocation_1;
  ProfileId profileId;
  PropertyId slot_1;
  PropertyId propertyId_1;
  PropertyId slot;
  uint32 frameDisplayIndex_1;
  uint32 frameDisplayIndex;
  PropertyIdIndexType propertyIndex;
  PropertyId propertyId;
  DynamicLoadRecord rec;
  undefined1 local_80 [8];
  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  recList;
  RegSlot tmpLocation;
  Scope *symScope;
  Scope *scope;
  PropertyId envIndex;
  RegSlot scopeLocation;
  FuncInfo *funcInfo_local;
  IdentPtr pid_local;
  Symbol *sym_local;
  ByteCodeGenerator *pBStack_10;
  RegSlot lhsLocation_local;
  ByteCodeGenerator *this_local;
  
  scope._4_4_ = ~Invalid;
  scope._0_4_ = -1;
  symScope = (Scope *)0x0;
  _envIndex = funcInfo;
  funcInfo_local = (FuncInfo *)pid;
  pid_local = (IdentPtr)sym;
  sym_local._4_4_ = lhsLocation;
  pBStack_10 = this;
  if (sym == (Symbol *)0x0) {
    local_e0 = this->globalScope;
  }
  else {
    local_e0 = Symbol::GetScope(sym);
  }
  if (local_e0 == (Scope *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1589,"(symScope)","symScope");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 0;
  }
  if ((pid_local == (IdentPtr)0x0) ||
     (bVar2 = Symbol::GetIsModuleExportStorage((Symbol *)pid_local), !bVar2)) {
    JsUtil::
    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    List((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)local_80,this->alloc,4);
    while( true ) {
      symScope = FindScopeForSym(this,local_e0,symScope,(PropertyId *)&scope,_envIndex);
      pFVar15 = _envIndex;
      if (symScope == this->globalScope) {
        scope._4_4_ = ~Env;
      }
      else if ((int)scope == -1) {
        pFVar14 = Scope::GetFunc(symScope);
        if (pFVar15 != pFVar14) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x159f,"(funcInfo == scope->GetFunc())","funcInfo == scope->GetFunc()"
                            );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 0;
        }
        scope._4_4_ = Scope::GetLocation(symScope);
      }
      if (symScope == local_e0) break;
      if ((symScope == (Scope *)0x0) || (bVar2 = Scope::GetIsDynamic(symScope), !bVar2)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x15a9,"(scope && scope->GetIsDynamic())",
                           "scope && scope->GetIsDynamic()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
      bVar2 = Scope::GetIsObject(symScope);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x15aa,"(scope->GetIsObject())","scope->GetIsObject()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
      DynamicLoadRecord::DynamicLoadRecord((DynamicLoadRecord *)&propertyIndex);
      propertyId = Js::ByteCodeWriter::DefineLabel(&this->m_writer);
      if (pid_local == (IdentPtr)0x0) {
        local_110 = Ident::GetPropertyId((Ident *)funcInfo_local);
      }
      else {
        local_110 = Symbol::EnsurePosition((Symbol *)pid_local,this);
      }
      uVar10 = FuncInfo::FindOrAddReferencedPropertyId(_envIndex,local_110);
      SVar4 = Scope::GetScopeType(symScope);
      iVar12 = (int)scope;
      if (SVar4 == ScopeType_With) {
        if ((int)scope == -1) {
          Js::ByteCodeWriter::BrProperty
                    (&this->m_writer,BrOnHasProperty,propertyId,scope._4_4_,uVar10);
          propertyIndex = 3;
          rec.kind = scope._4_4_;
        }
        else {
          uVar8 = Js::FrameDisplay::GetOffsetOfScopes();
          DVar5 = iVar12 + (uVar8 >> 3);
          Js::ByteCodeWriter::BrEnvProperty
                    (&this->m_writer,BrOnHasEnvProperty,propertyId,uVar10,DVar5);
          propertyIndex = 4;
          rec.kind = DVar5;
        }
      }
      else if ((int)scope == -1) {
        Js::ByteCodeWriter::BrLocalProperty(&this->m_writer,BrOnHasLocalProperty,propertyId,uVar10);
        propertyIndex = 1;
        rec.kind = scope._4_4_;
      }
      else {
        uVar8 = Js::FrameDisplay::GetOffsetOfScopes();
        DVar5 = iVar12 + (uVar8 >> 3);
        Js::ByteCodeWriter::BrEnvProperty
                  (&this->m_writer,BrOnHasLocalEnvProperty,propertyId,uVar10,DVar5);
        propertyIndex = 2;
        rec.kind = DVar5;
      }
      JsUtil::
      List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::Add((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)local_80,(DynamicLoadRecord *)&propertyIndex);
    }
    if (((pid_local == (IdentPtr)0x0) ||
        (bVar2 = Symbol::GetNeedDeclaration((Symbol *)pid_local), !bVar2)) ||
       (pFVar15 = Scope::GetFunc(symScope), pFVar15 != _envIndex)) {
      if ((pid_local == (IdentPtr)0x0) || (bVar2 = Symbol::GetIsGlobal((Symbol *)pid_local), bVar2))
      {
        if (pid_local == (IdentPtr)0x0) {
          local_15c = Ident::GetPropertyId((Ident *)funcInfo_local);
        }
        else {
          local_15c = Symbol::EnsurePosition((Symbol *)pid_local,this);
        }
        RVar7 = sym_local._4_4_;
        pFVar15 = _envIndex;
        if ((this->flags & 0x400) == 0) {
          if ((this->flags & 4) == 0) {
            EmitTypeOfFld(this,_envIndex,local_15c,sym_local._4_4_,0xfffffffd,LdRootFldForTypeOf,
                          false);
          }
          else {
            RVar11 = FuncInfo::GetEnvRegister(_envIndex);
            EmitTypeOfFld(this,pFVar15,local_15c,RVar7,RVar11,ScopedLdFldForTypeOf,false);
          }
        }
        else {
          bVar2 = Js::ParseableFunctionInfo::GetIsStrictMode(_envIndex->byteCodeFunction);
          if ((bVar2) && (bVar2 = FuncInfo::IsGlobalFunction(_envIndex), bVar2)) {
            EmitTypeOfFld(this,_envIndex,local_15c,sym_local._4_4_,_envIndex->frameDisplayRegister,
                          ScopedLdFldForTypeOf,false);
          }
          else {
            RVar7 = sym_local._4_4_;
            pFVar15 = _envIndex;
            RVar11 = FuncInfo::GetEnvRegister(_envIndex);
            EmitTypeOfFld(this,pFVar15,local_15c,RVar7,RVar11,ScopedLdFldForTypeOf,false);
          }
        }
      }
      else {
        bVar2 = Symbol::IsInSlot((Symbol *)pid_local,this,_envIndex,false);
        RVar7 = sym_local._4_4_;
        if ((bVar2) || ((int)scope != -1)) {
          PVar6 = Symbol::EnsureScopeSlot((Symbol *)pid_local,this,_envIndex);
          profileId_00 = FuncInfo::FindOrAddSlotProfileId(_envIndex,symScope,PVar6);
          RVar7 = FuncInfo::AcquireTmpRegister(_envIndex);
          bVar2 = NeedCheckBlockVar(this,(Symbol *)pid_local,symScope,_envIndex);
          op_00 = GetLdSlotOp(this,symScope,(int)scope,scope._4_4_,_envIndex);
          this_00 = Symbol::GetScope((Symbol *)pid_local);
          bVar3 = Scope::GetIsObject(this_00);
          iVar12 = (int)scope;
          iVar17 = 2;
          if (bVar3) {
            iVar17 = 0;
          }
          uVar8 = PVar6 + iVar17;
          if ((int)scope == -1) {
            if ((scope._4_4_ == ~Invalid) ||
               ((scope._4_4_ != _envIndex->frameSlotsRegister &&
                (scope._4_4_ != _envIndex->frameObjRegister)))) {
              bVar3 = Scope::HasInnerScopeIndex(symScope);
              if (bVar3) {
                uVar10 = Scope::GetInnerScopeIndex(symScope);
                Js::ByteCodeWriter::SlotI2(&this->m_writer,op_00,RVar7,uVar10,uVar8,profileId_00);
              }
              else {
                bVar3 = Scope::GetIsObject(symScope);
                if (!bVar3) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar13 = 1;
                  bVar3 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                     ,0x1614,"(scope->GetIsObject())","scope->GetIsObject()");
                  if (!bVar3) {
                    pcVar1 = (code *)invalidInstructionException();
                    (*pcVar1)();
                  }
                  puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar13 = 0;
                }
                Js::ByteCodeWriter::Slot(&this->m_writer,op_00,RVar7,scope._4_4_,uVar8,profileId_00)
                ;
              }
            }
            else {
              Js::ByteCodeWriter::SlotI1(&this->m_writer,op_00,RVar7,uVar8,profileId_00);
            }
          }
          else {
            uVar9 = Js::FrameDisplay::GetOffsetOfScopes();
            Js::ByteCodeWriter::SlotI2
                      (&this->m_writer,op_00,RVar7,iVar12 + (uVar9 >> 3),uVar8,profileId_00);
          }
          if (bVar2) {
            Js::ByteCodeWriter::Reg1(&this->m_writer,ChkUndecl,RVar7);
          }
          Js::ByteCodeWriter::Reg2(&this->m_writer,Typeof,sym_local._4_4_,RVar7);
          FuncInfo::ReleaseTmpRegister(_envIndex,RVar7);
        }
        else {
          RVar11 = Symbol::GetLocation((Symbol *)pid_local);
          Js::ByteCodeWriter::Reg2(&this->m_writer,Typeof,RVar7,RVar11);
        }
      }
    }
    else {
      bVar2 = Symbol::IsInSlot((Symbol *)pid_local,this,_envIndex,false);
      if (bVar2) {
        PVar6 = Symbol::EnsureScopeSlot((Symbol *)pid_local,this,_envIndex);
        FuncInfo::FindOrAddSlotProfileId(_envIndex,symScope,PVar6);
      }
      EmitUseBeforeDeclarationRuntimeError(this,sym_local._4_4_);
    }
    bVar2 = JsUtil::ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>::Empty
                      ((ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer> *)
                       local_80);
    if (!bVar2) {
      labelID = Js::ByteCodeWriter::DefineLabel(&this->m_writer);
      Js::ByteCodeWriter::Br(&this->m_writer,labelID);
      propertyId_2 = 0;
      while( true ) {
        if (pid_local == (IdentPtr)0x0) {
          local_218 = Ident::GetPropertyId((Ident *)funcInfo_local);
        }
        else {
          local_218 = Symbol::EnsurePosition((Symbol *)pid_local,this);
        }
        pTVar16 = JsUtil::
                  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_80,propertyId_2);
        Js::ByteCodeWriter::MarkLabel(&this->m_writer,pTVar16->label);
        pTVar16 = JsUtil::
                  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_80,propertyId_2);
        RVar7 = sym_local._4_4_;
        pFVar15 = _envIndex;
        switch(pTVar16->kind) {
        case Local:
          pTVar16 = JsUtil::
                    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                            *)local_80,propertyId_2);
          EmitTypeOfFld(this,pFVar15,local_218,RVar7,(pTVar16->field_2).instance,LdLocalFld,true);
          break;
        case Env:
          RVar7 = FuncInfo::AcquireTmpRegister(_envIndex);
          pTVar16 = JsUtil::
                    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                            *)local_80,propertyId_2);
          Js::ByteCodeWriter::SlotI1(&this->m_writer,LdEnvObj,RVar7,(pTVar16->field_2).index);
          EmitTypeOfFld(this,_envIndex,local_218,sym_local._4_4_,RVar7,LdFldForTypeOf,true);
          FuncInfo::ReleaseTmpRegister(_envIndex,RVar7);
          break;
        case LocalWith:
          RVar7 = FuncInfo::AcquireTmpRegister(_envIndex);
          pTVar16 = JsUtil::
                    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                            *)local_80,propertyId_2);
          Js::ByteCodeWriter::Reg2(&this->m_writer,UnwrapWithObj,RVar7,(pTVar16->field_2).instance);
          EmitTypeOfFld(this,_envIndex,local_218,sym_local._4_4_,RVar7,LdFldForTypeOf,true);
          FuncInfo::ReleaseTmpRegister(_envIndex,RVar7);
          break;
        case EnvWith:
          RVar7 = FuncInfo::AcquireTmpRegister(_envIndex);
          pTVar16 = JsUtil::
                    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                            *)local_80,propertyId_2);
          Js::ByteCodeWriter::SlotI1(&this->m_writer,LdEnvObj,RVar7,(pTVar16->field_2).index);
          Js::ByteCodeWriter::Reg2(&this->m_writer,UnwrapWithObj,RVar7,RVar7);
          EmitTypeOfFld(this,_envIndex,local_218,sym_local._4_4_,RVar7,LdFldForTypeOf,true);
          FuncInfo::ReleaseTmpRegister(_envIndex,RVar7);
          break;
        default:
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x164d,"((0))","(0)");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 0;
        }
        iVar12 = JsUtil::ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>::
                 Count((ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer> *)
                       local_80);
        if (propertyId_2 == iVar12 + -1) break;
        Js::ByteCodeWriter::Br(&this->m_writer,labelID);
        propertyId_2 = propertyId_2 + 1;
      }
      Js::ByteCodeWriter::MarkLabel(&this->m_writer,labelID);
    }
    JsUtil::
    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    ~List((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           *)local_80);
  }
  else {
    recList._44_4_ = FuncInfo::AcquireTmpRegister(_envIndex);
    EmitModuleExportAccess(this,(Symbol *)pid_local,LdModuleSlot,recList._44_4_,_envIndex);
    Js::ByteCodeWriter::Reg2(&this->m_writer,Typeof,sym_local._4_4_,recList._44_4_);
    FuncInfo::ReleaseTmpRegister(_envIndex,recList._44_4_);
  }
  return;
}

Assistant:

void ByteCodeGenerator::EmitPropTypeof(Js::RegSlot lhsLocation, Symbol *sym, IdentPtr pid, FuncInfo *funcInfo)
{
    // If sym belongs to a parent frame, delete it from the closure environment.
    // If it belongs to this func, but there's a non-local reference, get it from the heap-allocated frame.
    // (TODO: optimize this by getting the sym from its normal location if there are no non-local defs.)
    // Otherwise, just return false

    Js::RegSlot scopeLocation = Js::Constants::NoRegister;
    Js::PropertyId envIndex = -1;
    Scope *scope = nullptr;
    Scope *symScope = sym ? sym->GetScope() : this->globalScope;
    Assert(symScope);

    if (sym && sym->GetIsModuleExportStorage())
    {
        Js::RegSlot tmpLocation = funcInfo->AcquireTmpRegister();
        EmitModuleExportAccess(sym, Js::OpCode::LdModuleSlot, tmpLocation, funcInfo);
        this->m_writer.Reg2(Js::OpCode::Typeof, lhsLocation, tmpLocation);
        funcInfo->ReleaseTmpRegister(tmpLocation);
        return;
    }

    JsUtil::List<DynamicLoadRecord, ArenaAllocator> recList(this->alloc);

    for (;;)
    {
        scope = this->FindScopeForSym(symScope, scope, &envIndex, funcInfo);
        if (scope == this->globalScope)
        {
            scopeLocation = ByteCodeGenerator::RootObjectRegister;
        }
        else if (envIndex == -1)
        {
            Assert(funcInfo == scope->GetFunc());
            scopeLocation = scope->GetLocation();
        }

        if (scope == symScope)
        {
            break;
        }

        // Found a scope to which the property may have been added.
        Assert(scope && scope->GetIsDynamic());
        AssertOrFailFast(scope->GetIsObject());

        DynamicLoadRecord rec;

        rec.label = this->m_writer.DefineLabel();
        Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
        Js::PropertyIdIndexType propertyIndex = funcInfo->FindOrAddReferencedPropertyId(propertyId);

        if (scope->GetScopeType() != ScopeType_With)
        {
            if (envIndex == -1)
            {
                this->m_writer.BrLocalProperty(Js::OpCode::BrOnHasLocalProperty, rec.label, propertyIndex);
                rec.kind = DynamicLoadKind::Local;
                rec.instance = scopeLocation;
            }
            else
            {
                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasLocalEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::Env;
                rec.index = frameDisplayIndex;
            }
        }
        else
        {
            if (envIndex == -1)
            {
                this->m_writer.BrProperty(Js::OpCode::BrOnHasProperty, rec.label, scopeLocation, propertyIndex);
                rec.kind = DynamicLoadKind::LocalWith;
                rec.instance = scopeLocation;
            }
            else
            {
                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::EnvWith;
                rec.index = frameDisplayIndex;
            }
        }

        recList.Add(rec);
    }

    // Arrived at the scope in which the property was defined.
    if (sym && sym->GetNeedDeclaration() && scope->GetFunc() == funcInfo)
    {
        // Ensure this symbol has a slot if it needs one.
        if (sym->IsInSlot(this, funcInfo))
        {
            Js::PropertyId slot = sym->EnsureScopeSlot(this, funcInfo);
            funcInfo->FindOrAddSlotProfileId(scope, slot);
        }

        EmitUseBeforeDeclarationRuntimeError(this, lhsLocation);
    }
    else if (sym == nullptr || sym->GetIsGlobal())
    {
        Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
        if (this->flags & fscrEval)
        {
            if (funcInfo->byteCodeFunction->GetIsStrictMode() && funcInfo->IsGlobalFunction())
            {
                this->EmitTypeOfFld(funcInfo, propertyId, lhsLocation, funcInfo->frameDisplayRegister, Js::OpCode::ScopedLdFldForTypeOf);
            }
            else
            {
                this->EmitTypeOfFld(funcInfo, propertyId, lhsLocation, funcInfo->GetEnvRegister(), Js::OpCode::ScopedLdFldForTypeOf);
            }
        }
        else if (this->flags & fscrImplicitThis)
        {
            this->EmitTypeOfFld(funcInfo, propertyId, lhsLocation, funcInfo->GetEnvRegister(), Js::OpCode::ScopedLdFldForTypeOf);
        }
        else
        {
            this->EmitTypeOfFld(funcInfo, propertyId, lhsLocation, ByteCodeGenerator::RootObjectRegister, Js::OpCode::LdRootFldForTypeOf);
        }
    }
    else if (sym->IsInSlot(this, funcInfo) || envIndex != -1)
    {
        // Make sure the property has a slot. This will bump up the size of the slot array if necessary.
        Js::PropertyId slot = sym->EnsureScopeSlot(this, funcInfo);
        Js::ProfileId profileId = funcInfo->FindOrAddSlotProfileId(scope, slot);
        Js::RegSlot tmpLocation = funcInfo->AcquireTmpRegister();
        bool chkBlockVar = NeedCheckBlockVar(sym, scope, funcInfo);
        Js::OpCode op;

        op = this->GetLdSlotOp(scope, envIndex, scopeLocation, funcInfo);
        slot = slot + (sym->GetScope()->GetIsObject() ? 0 : Js::ScopeSlots::FirstSlotIndex);

        if (envIndex != -1)
        {
            this->m_writer.SlotI2(op, tmpLocation, envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var), slot, profileId);
        }
        else if (scopeLocation != Js::Constants::NoRegister &&
            (scopeLocation == funcInfo->frameSlotsRegister || scopeLocation == funcInfo->frameObjRegister))
        {
            this->m_writer.SlotI1(op, tmpLocation, slot, profileId);
        }
        else if (scope->HasInnerScopeIndex())
        {
            this->m_writer.SlotI2(op, tmpLocation, scope->GetInnerScopeIndex(), slot, profileId);
        }
        else
        {
            AssertOrFailFast(scope->GetIsObject());
            this->m_writer.Slot(op, tmpLocation, scopeLocation, slot, profileId);
        }

        if (chkBlockVar)
        {
            this->m_writer.Reg1(Js::OpCode::ChkUndecl, tmpLocation);
        }

        this->m_writer.Reg2(Js::OpCode::Typeof, lhsLocation, tmpLocation);
        funcInfo->ReleaseTmpRegister(tmpLocation);
    }
    else
    {
        this->m_writer.Reg2(Js::OpCode::Typeof, lhsLocation, sym->GetLocation());
    }

    if (!recList.Empty())
    {
        Js::ByteCodeLabel doneLabel = this->m_writer.DefineLabel();
        this->m_writer.Br(doneLabel);

        for (int i = 0;; i++)
        {
            Js::RegSlot instLocation;
            Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();

            this->m_writer.MarkLabel(recList.Item(i).label);
            switch(recList.Item(i).kind)
            {
                case DynamicLoadKind::Local:
                    this->EmitTypeOfFld(funcInfo, propertyId, lhsLocation, recList.Item(i).instance, Js::OpCode::LdLocalFld, true);
                    break;

                case DynamicLoadKind::Env:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj, instLocation, recList.Item(i).index);
                    this->EmitTypeOfFld(funcInfo, propertyId, lhsLocation, instLocation, Js::OpCode::LdFldForTypeOf, true);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                case DynamicLoadKind::LocalWith:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj, instLocation, recList.Item(i).instance);
                    this->EmitTypeOfFld(funcInfo, propertyId, lhsLocation, instLocation, Js::OpCode::LdFldForTypeOf, true);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                case DynamicLoadKind::EnvWith:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj, instLocation, recList.Item(i).index);
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj, instLocation, instLocation);
                    this->EmitTypeOfFld(funcInfo, propertyId, lhsLocation, instLocation, Js::OpCode::LdFldForTypeOf, true);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                default:
                    AssertOrFailFast(UNREACHED);
            }

            if (i == recList.Count() - 1)
            {
                break;
            }
            this->m_writer.Br(doneLabel);
        }

        this->m_writer.MarkLabel(doneLabel);
    }
}